

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O3

void __thiscall
ConfidentialTxIn_Constractor2_Test::TestBody(ConfidentialTxIn_Constractor2_Test *this)

{
  undefined8 uVar1;
  bool bVar2;
  uint32_t uVar3;
  AssertHelperData *pAVar4;
  AssertHelperData *pAVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  size_t sVar9;
  undefined1 local_2a0 [32];
  AssertionResult gtest_ar;
  undefined1 local_270 [40];
  undefined1 local_248 [32];
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_11;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1e8;
  ScriptWitness exp_witness_stack;
  ScriptWitness exp_pegin_witness;
  ConfidentialTxIn txin3;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            (&txin3,&exp_txid,2,0xfffffffe,&exp_script,&exp_witness_stack,&exp_blinding_nonce,
             &exp_asset_entropy,&exp_issuance_amount,&exp_inflation_keys,
             &exp_issuance_amount_rangeproof,&exp_inflation_keys_rangeproof,&exp_pegin_witness);
  local_2a0._0_4_ = cfd::core::AbstractTxIn::GetVout(&txin3.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin3.GetVout()","exp_index",(uint *)local_2a0,&exp_index);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_2a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_2a0._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2a0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar3 = cfd::core::AbstractTxIn::GetSequence(&txin3.super_AbstractTxIn);
  local_2a0._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin3.GetSequence()","exp_sequence",(uint *)local_2a0,
             &exp_sequence);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_2a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_2a0._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_2a0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::AbstractTxIn::GetTxid((Txid *)local_2a0,&txin3.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&gtest_ar,(Txid *)local_2a0);
  uVar1 = gtest_ar._0_8_;
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_248,&exp_txid);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             (char *)uVar1,(char *)local_248._0_8_);
  pAVar5 = (AssertHelperData *)(local_248 + 0x10);
  if ((AssertHelperData *)local_248._0_8_ != pAVar5) {
    operator_delete((void *)local_248._0_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_270) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  local_2a0._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_2a0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_2a0._8_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetUnlockingScript((Script *)&gtest_ar,&txin3.super_AbstractTxIn);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_2a0,(Script *)&gtest_ar);
  uVar1 = local_2a0._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_248,&exp_script);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",(char *)uVar1,(char *)local_248._0_8_);
  if ((AssertHelperData *)local_248._0_8_ != pAVar5) {
    operator_delete((void *)local_248._0_8_);
  }
  if ((AssertHelperData *)local_2a0._0_8_ != (AssertHelperData *)(local_2a0 + 0x10)) {
    operator_delete((void *)local_2a0._0_8_);
  }
  cfd::core::Script::~Script((Script *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x5f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248._0_8_ = (AssertHelperData *)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = 0;
  uVar6 = (long)txin3.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin3.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar6);
    sVar9 = (long)txin3.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)txin3.blinding_nonce_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_248._16_8_ = uVar6 + (long)pAVar4;
  local_248._0_8_ = pAVar4;
  if (txin3.blinding_nonce_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      txin3.blinding_nonce_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_248._8_8_ = pAVar4;
    memmove(pAVar4,txin3.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_248._8_8_ = (long)&pAVar4->type + sVar9;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData256 *)local_248);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_2a0,&exp_blinding_nonce);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",(char *)uVar1,(char *)local_2a0._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2a0 + 0x10))
  {
    operator_delete((void *)local_2a0._0_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_270) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_248._0_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x61,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248._0_8_ = (AssertHelperData *)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = 0;
  uVar6 = (long)txin3.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin3.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar6);
    sVar9 = (long)txin3.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)txin3.asset_entropy_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_248._16_8_ = uVar6 + (long)pAVar4;
  local_248._0_8_ = pAVar4;
  if (txin3.asset_entropy_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      txin3.asset_entropy_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_248._8_8_ = pAVar4;
    memmove(pAVar4,txin3.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_248._8_8_ = (long)&pAVar4->type + sVar9;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData256 *)local_248);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_2a0,&exp_asset_entropy);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",(char *)uVar1,(char *)local_2a0._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2a0 + 0x10))
  {
    operator_delete((void *)local_2a0._0_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_270) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_248._0_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,99,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin3.issuance_amount_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_2a0,(ConfidentialValue *)&gtest_ar);
  uVar1 = local_2a0._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_248,&exp_issuance_amount);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",(char *)uVar1,(char *)local_248._0_8_);
  if ((AssertHelperData *)local_248._0_8_ != pAVar5) {
    operator_delete((void *)local_248._0_8_);
  }
  if ((AssertHelperData *)local_2a0._0_8_ != (AssertHelperData *)(local_2a0 + 0x10)) {
    operator_delete((void *)local_2a0._0_8_);
  }
  gtest_ar._0_8_ = &PTR__ConfidentialValue_0068d0c0;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x65,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&gtest_ar,&txin3.inflation_keys_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_2a0,(ConfidentialValue *)&gtest_ar);
  uVar1 = local_2a0._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_248,&exp_inflation_keys);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",(char *)uVar1,(char *)local_248._0_8_);
  if ((AssertHelperData *)local_248._0_8_ != pAVar5) {
    operator_delete((void *)local_248._0_8_);
  }
  if ((AssertHelperData *)local_2a0._0_8_ != (AssertHelperData *)(local_2a0 + 0x10)) {
    operator_delete((void *)local_2a0._0_8_);
  }
  gtest_ar._0_8_ = &PTR__ConfidentialValue_0068d0c0;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x67,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248._0_8_ = (AssertHelperData *)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = 0;
  uVar6 = (long)txin3.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin3.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar5 = (AssertHelperData *)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar5 = (AssertHelperData *)operator_new(uVar6);
    sVar9 = (long)txin3.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)txin3.issuance_amount_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_248._16_8_ = uVar6 + (long)pAVar5;
  local_248._0_8_ = pAVar5;
  if (txin3.issuance_amount_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      txin3.issuance_amount_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_248._8_8_ = pAVar5;
    memmove(pAVar5,txin3.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_248._8_8_ = (long)&pAVar5->type + sVar9;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)local_248);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2a0,&exp_issuance_amount_rangeproof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",(char *)uVar1,(char *)local_2a0._0_8_
            );
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2a0 + 0x10))
  {
    operator_delete((void *)local_2a0._0_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_270) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_248._0_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x69,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_248._0_8_ = (AssertHelperData *)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = 0;
  uVar6 = (long)txin3.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)txin3.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar6 == 0) {
    pAVar5 = (AssertHelperData *)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar6 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar5 = (AssertHelperData *)operator_new(uVar6);
    sVar9 = (long)txin3.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)txin3.inflation_keys_rangeproof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_248._16_8_ = uVar6 + (long)pAVar5;
  local_248._0_8_ = pAVar5;
  if (txin3.inflation_keys_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      txin3.inflation_keys_rangeproof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_248._8_8_ = pAVar5;
    memmove(pAVar5,txin3.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_248._8_8_ = (long)&pAVar5->type + sVar9;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData *)local_248);
  uVar1 = gtest_ar._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_2a0,&exp_inflation_keys_rangeproof);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"txin3.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",(char *)uVar1,(char *)local_2a0._0_8_)
  ;
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2a0 + 0x10))
  {
    operator_delete((void *)local_2a0._0_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_270) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_248._0_8_);
  }
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x6b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_2.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = cfd::core::AbstractTxIn::GetScriptWitnessStackNum(&txin3.super_AbstractTxIn);
  local_2a0._0_4_ = uVar3;
  uVar3 = cfd::core::ScriptWitness::GetWitnessNum(&exp_witness_stack);
  local_248._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin3.GetScriptWitnessStackNum()",
             "exp_witness_stack.GetWitnessNum()",(uint *)local_2a0,(uint *)local_248);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_2a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x6d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_2a0._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2a0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::AbstractTxIn::GetScriptWitness((ScriptWitness *)&gtest_ar,&txin3.super_AbstractTxIn);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_248,
             (ScriptWitness *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar.message_
            );
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_2,
             &exp_witness_stack);
  if (local_248._8_8_ != local_248._0_8_) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar,(ByteData *)(local_248._0_8_ + lVar8));
      uVar1 = gtest_ar._0_8_;
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)local_2a0,
                 (ByteData *)(CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + lVar8));
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_11,"test_vector[idx].GetHex().c_str()",
                 "exp_vector[idx].GetHex().c_str()",(char *)uVar1,(char *)local_2a0._0_8_);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_2a0 + 0x10)) {
        operator_delete((void *)local_2a0._0_8_);
      }
      if ((undefined1 *)gtest_ar._0_8_ != local_270) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      if (gtest_ar_11.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar7 = "";
        if (gtest_ar_11.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar_11.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_2a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x73,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
        if (gtest_ar._0_8_ != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (gtest_ar._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_11.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x18;
    } while (uVar6 < (ulong)(((long)(local_248._8_8_ - local_248._0_8_) >> 3) * -0x5555555555555555)
            );
  }
  uVar3 = cfd::core::ScriptWitness::GetWitnessNum(&txin3.pegin_witness_);
  local_2a0._0_4_ = uVar3;
  gtest_ar_11._0_4_ = cfd::core::ScriptWitness::GetWitnessNum(&exp_pegin_witness);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"txin3.GetPeginWitnessStackNum()",
             "exp_pegin_witness.GetWitnessNum()",(uint *)local_2a0,(uint *)&gtest_ar_11);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_2a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x76,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)local_2a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_2a0._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2a0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  gtest_ar._0_8_ = &PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar.message_
             ,&txin3.pegin_witness_.witness_stack_);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_11,
             (ScriptWitness *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar.message_
            );
  cfd::core::ScriptWitness::GetWitness(&local_1e8,&exp_pegin_witness);
  if (local_1e8.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_1e8.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)&gtest_ar,
                 (ByteData *)(CONCAT44(gtest_ar_11._4_4_,gtest_ar_11._0_4_) + lVar8));
      uVar1 = gtest_ar._0_8_;
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)local_2a0,
                 (ByteData *)
                 ((long)&((local_1e8.
                           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                           ._M_impl.super__Vector_impl_data._M_start)->data_).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar8));
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_13,"test_peg_vector[idx].GetHex().c_str()",
                 "exp_peg_vector[idx].GetHex().c_str()",(char *)uVar1,(char *)local_2a0._0_8_);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (local_2a0 + 0x10)) {
        operator_delete((void *)local_2a0._0_8_);
      }
      if ((undefined1 *)gtest_ar._0_8_ != local_270) {
        operator_delete((void *)gtest_ar._0_8_);
      }
      if (gtest_ar_13.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar7 = "";
        if (gtest_ar_13.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((gtest_ar_13.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_2a0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                   ,0x7c,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
        if (gtest_ar._0_8_ != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (gtest_ar._0_8_ != 0)) {
            (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_13.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x18;
    } while (uVar6 < (ulong)(((long)local_1e8.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1e8.
                                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  cfd::core::ConfidentialTxIn::GetWitnessHash((ByteData256 *)local_2a0,&txin3);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,(ByteData256 *)local_2a0);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_13,"txin3.GetWitnessHash().GetHex().c_str()",
             "\"c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c\"",
             (char *)gtest_ar._0_8_,
             "c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c");
  if ((undefined1 *)gtest_ar._0_8_ != local_270) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if ((AssertHelperData *)local_2a0._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_2a0._0_8_);
  }
  if (gtest_ar_13.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_13.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((gtest_ar_13.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x7f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a0);
    if (gtest_ar._0_8_ != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (gtest_ar._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_13.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1e8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_11);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_2);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_248);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&txin3);
  exp_pegin_witness._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_pegin_witness.witness_stack_);
  exp_witness_stack._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0067f138;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_witness_stack.witness_stack_);
  return;
}

Assistant:

TEST(ConfidentialTxIn, Constractor2) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();

  ConfidentialTxIn txin3(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_EQ(txin3.GetVout(), exp_index);
  EXPECT_EQ(txin3.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin3.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin3.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
  EXPECT_STREQ(txin3.GetBlindingNonce().GetHex().c_str(),
      exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin3.GetAssetEntropy().GetHex().c_str(),
      exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin3.GetIssuanceAmount().GetHex().c_str(),
      exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin3.GetInflationKeys().GetHex().c_str(),
      exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin3.GetIssuanceAmountRangeproof().GetHex().c_str(),
      exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin3.GetInflationKeysRangeproof().GetHex().c_str(),
      exp_inflation_keys_rangeproof.GetHex().c_str());
  EXPECT_EQ(txin3.GetScriptWitnessStackNum(),
      exp_witness_stack.GetWitnessNum());
  const std::vector<ByteData>& test_vector = txin3.GetScriptWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_vector = exp_witness_stack.GetWitness();
  for (size_t idx = 0; idx < test_vector.size(); ++idx) {
    EXPECT_STREQ(test_vector[idx].GetHex().c_str(),
        exp_vector[idx].GetHex().c_str());
  }
  EXPECT_EQ(txin3.GetPeginWitnessStackNum(),
      exp_pegin_witness.GetWitnessNum());
  const std::vector<ByteData>& test_peg_vector = txin3.GetPeginWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
        exp_peg_vector[idx].GetHex().c_str());
  }
  EXPECT_STREQ(txin3.GetWitnessHash().GetHex().c_str(),
    "c91991b67af0a40f5d200ba356b02afd3ae2c37174d0d79707a6bd6f9c69ce8c");
}